

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fretInit.c
# Opt level: O3

void Abc_FlowRetime_UpdateForwardInit(Abc_Ntk_t *pNtk)

{
  ulong uVar1;
  int iVar2;
  long *plVar3;
  Abc_Obj_t *pObj;
  int *__s;
  Vec_Ptr_t *pVVar4;
  long lVar5;
  uint uVar6;
  long lVar7;
  int iVar8;
  
  if (pManMR->fVerbose != 0) {
    puts("\t\tupdating init state");
  }
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar2 = pNtk->vObjs->nSize;
    uVar1 = (long)iVar2 + 500;
    iVar8 = (int)uVar1;
    if ((pNtk->vTravIds).nCap < iVar8) {
      __s = (int *)malloc(uVar1 * 4);
      (pNtk->vTravIds).pArray = __s;
      if (__s == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vTravIds).nCap = iVar8;
    }
    else {
      __s = (int *)0x0;
    }
    if (-500 < iVar2) {
      memset(__s,0,(uVar1 & 0xffffffff) << 2);
    }
    (pNtk->vTravIds).nSize = iVar8;
  }
  iVar2 = pNtk->nTravIds;
  pNtk->nTravIds = iVar2 + 1;
  if (iVar2 < 0x3fffffff) {
    pVVar4 = pNtk->vBoxes;
    if (0 < pVVar4->nSize) {
      lVar7 = 0;
      do {
        plVar3 = (long *)pVVar4->pArray[lVar7];
        if ((*(uint *)((long)plVar3 + 0x14) & 0xf) == 8) {
          pObj = *(Abc_Obj_t **)
                  (*(long *)(*(long *)(*plVar3 + 0x20) + 8) + (long)*(int *)plVar3[4] * 8);
          Abc_FlowRetime_UpdateForwardInit_rec(pObj);
          if ((undefined1  [24])
              ((undefined1  [24])pManMR->pDataArray[(uint)pObj->Id] & (undefined1  [24])0x20) ==
              (undefined1  [24])0x0) {
            uVar6 = *(uint *)((long)plVar3 + 0x14) & 0xf;
            if ((undefined1  [24])
                ((undefined1  [24])pManMR->pDataArray[(uint)pObj->Id] & (undefined1  [24])0x40) ==
                (undefined1  [24])0x0) {
              lVar5 = 3;
              if (uVar6 != 8) {
                __assert_fail("Abc_ObjIsLatch(pLatch)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                              ,0x1a6,"void Abc_LatchSetInitDc(Abc_Obj_t *)");
              }
            }
            else {
              lVar5 = 2;
              if (uVar6 != 8) {
                __assert_fail("Abc_ObjIsLatch(pLatch)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                              ,0x1a5,"void Abc_LatchSetInit1(Abc_Obj_t *)");
              }
            }
          }
          else {
            lVar5 = 1;
            if ((*(uint *)((long)plVar3 + 0x14) & 0xf) != 8) {
              __assert_fail("Abc_ObjIsLatch(pLatch)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                            ,0x1a4,"void Abc_LatchSetInit0(Abc_Obj_t *)");
            }
          }
          plVar3[7] = lVar5;
        }
        lVar7 = lVar7 + 1;
        pVVar4 = pNtk->vBoxes;
      } while (lVar7 < pVVar4->nSize);
    }
    return;
  }
  __assert_fail("p->nTravIds < (1<<30)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abc.h"
                ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
}

Assistant:

void Abc_FlowRetime_UpdateForwardInit( Abc_Ntk_t * pNtk ) {
  Abc_Obj_t *pObj, *pFanin;
  int i;

  vprintf("\t\tupdating init state\n");

  Abc_NtkIncrementTravId( pNtk );

  Abc_NtkForEachLatch( pNtk, pObj, i ) {
    pFanin = Abc_ObjFanin0(pObj);
    Abc_FlowRetime_UpdateForwardInit_rec( pFanin );

    if (FTEST(pFanin, INIT_0))
      Abc_LatchSetInit0( pObj );
    else if (FTEST(pFanin, INIT_1))
      Abc_LatchSetInit1( pObj );
    else
      Abc_LatchSetInitDc( pObj );
  }
}